

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

ArgumentParserWithOutputVariable<Arguments> * __thiscall
anon_unknown.dwarf_27eb59::ArgumentParserWithOutputVariable<Arguments>::Bind<bool>
          (ArgumentParserWithOutputVariable<Arguments> *this,static_string_view name,
          offset_in_Arguments_to_bool member)

{
  offset_in_Arguments_to_bool member_local;
  ArgumentParserWithOutputVariable<Arguments> *this_local;
  static_string_view name_local;
  
  cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)this,name,member);
  return this;
}

Assistant:

ArgumentParserWithOutputVariable& Bind(cm::static_string_view name,
                                         T Result::*member)
  {
    this->cmArgumentParser<Result>::Bind(name, member);
    return *this;
  }